

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualTo.hpp
# Opt level: O2

string * __thiscall
ut11::Operands::EqualTo<int>::GetErrorMessage<int>
          (string *__return_storage_ptr__,EqualTo<int> *this,int *actual)

{
  ostream *poVar1;
  stringstream errorMessage;
  string sStack_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Expected ");
  utility::ToString<int>(&local_1c8,this->m_expected);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  poVar1 = std::operator<<(poVar1," but was ");
  utility::ToString<int>(&sStack_1e8,actual);
  std::operator<<(poVar1,(string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const T& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected " << utility::ToString(m_expected) << " but was " << utility::ToString(actual);
				return errorMessage.str();
			}